

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::CallActivate(AActor *this,AActor *activator)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  long lVar2;
  VMValue params [2];
  
  if (CallActivate::VIndex == 0xffffffff) {
    CallActivate::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"Activate");
    if (CallActivate::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x12fd,"void AActor::CallActivate(AActor *)");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((CallActivate::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[CallActivate::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0._8_4_ = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[1].field_0.field_3.Type = '\x03';
    params[0].field_0._0_8_ = this;
    params[1].field_0._0_8_ = activator;
    params[1].field_0._8_4_ = params[0].field_0._8_4_;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,2,(VMReturn *)0x0,0,(VMException **)0x0);
    lVar2 = 0x10;
    do {
      VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
    return;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[0xd])(this,activator);
  return;
}

Assistant:

void AActor::CallActivate(AActor *activator)
{
	IFVIRTUAL(AActor, Activate)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[2] = { (DObject*)this, (DObject*)activator };
		GlobalVMStack.Call(func, params, 2, nullptr, 0, nullptr);
	}
	else Activate(activator);
}